

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_addsub(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGTemp *pTVar1;
  TCGv_i32 arg2;
  TCGv_i32 pTVar2;
  uint uVar3;
  int mode;
  uint mode_00;
  int iVar4;
  int iVar5;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGv_i32 pTVar6;
  bool bVar7;
  undefined8 *local_40;
  TCGv_i32 addr;
  
  s_00 = s->uc->tcg_ctx;
  uVar3 = (uint)(insn >> 6);
  bVar7 = true;
  switch(uVar3 & 3) {
  case 1:
    bVar7 = false;
  default:
    pTVar2 = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(uVar3 & 0x38));
    pTVar1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    iVar5 = s->release_count;
    if (7 < (long)iVar5) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                 ,0x91,"s->release_count < MAX_TO_RELEASE");
    }
    local_40 = (undefined8 *)((long)s_00->cpu_dregs + (ulong)(uVar3 & 0x38));
    pTVar6 = (TCGv_i32)((long)pTVar1 - (long)s_00);
    s->release_count = iVar5 + 1;
    s->release[iVar5] = pTVar6;
    if (bVar7) {
      tcg_gen_ext8s_i32_m68k(s_00,pTVar6,pTVar2);
      iVar5 = 0;
    }
    else {
      tcg_gen_ext16s_i32_m68k(s_00,pTVar6,pTVar2);
      iVar5 = 1;
    }
    break;
  case 2:
    local_40 = (undefined8 *)((long)s_00->cpu_dregs + (ulong)(uVar3 & 0x38));
    pTVar6 = (TCGv_i32)*local_40;
    iVar5 = 2;
  }
  pTVar1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  bVar7 = (((s->base).tb)->flags & 0x2000) == 0;
  mode_00 = insn >> 3 & 7;
  uVar3 = insn & 7;
  if ((insn >> 8 & 1) == 0) {
    arg2 = gen_ea_mode(env,s,mode_00,uVar3,iVar5,s_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                       (uint)bVar7);
    pTVar2 = pTVar6;
    if (arg2 == s_00->NULL_QREG) {
      gen_exception(s,(s->base).pc_next,3);
      return;
    }
LAB_006f9f73:
    pTVar6 = (TCGv_i32)((long)pTVar1 - (long)s_00);
    if ((insn >> 0xe & 1) == 0) {
      tcg_gen_setcond_i32_m68k(s_00,TCG_COND_LTU,QREG_CC_X,pTVar2,arg2);
      tcg_gen_sub_i32(s_00,pTVar6,pTVar2,arg2);
      iVar4 = 5;
    }
    else {
      tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)pTVar1,(TCGArg)(pTVar2 + (long)s_00),
                       (TCGArg)(arg2 + (long)&s_00->pool_cur));
      tcg_gen_setcond_i32_m68k(s_00,TCG_COND_LTU,QREG_CC_X,pTVar6,arg2);
      iVar4 = 2;
    }
    set_cc_op(s,iVar4 + iVar5);
    gen_update_cc_add(s_00,pTVar6,arg2,iVar5);
    if ((insn >> 8 & 1) == 0) {
      gen_partset_reg(s_00,iVar5,(TCGv_i32)*local_40,pTVar6);
    }
    else {
      pTVar2 = gen_ea_mode(env,s,mode_00,uVar3,iVar5,pTVar6,&addr,EA_STORE,
                           (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
      if (pTVar2 == s_00->NULL_QREG) goto LAB_006fa07b;
    }
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar6 + (long)s_00));
  }
  else {
    pTVar2 = gen_ea_mode(env,s,mode_00,uVar3,iVar5,s_00->NULL_QREG,&addr,EA_LOADS,(uint)bVar7);
    arg2 = pTVar6;
    if (pTVar2 != s_00->NULL_QREG) goto LAB_006f9f73;
LAB_006fa07b:
    gen_exception(s,(s->base).pc_next,3);
  }
  return;
}

Assistant:

DISAS_INSN(addsub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv dest;
    TCGv src;
    TCGv tmp;
    TCGv addr;
    int add;
    int opsize;

    add = (insn & 0x4000) != 0;
    opsize = insn_opsize(insn);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);
    dest = tcg_temp_new(tcg_ctx);
    if (insn & 0x100) {
        SRC_EA(env, tmp, opsize, 1, &addr);
        src = reg;
    } else {
        tmp = reg;
        SRC_EA(env, src, opsize, 1, NULL);
    }
    if (add) {
        tcg_gen_add_i32(tcg_ctx, dest, tmp, src);
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, src);
        set_cc_op(s, CC_OP_ADDB + opsize);
    } else {
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, tmp, src);
        tcg_gen_sub_i32(tcg_ctx, dest, tmp, src);
        set_cc_op(s, CC_OP_SUBB + opsize);
    }
    gen_update_cc_add(tcg_ctx, dest, src, opsize);
    if (insn & 0x100) {
        DEST_EA(env, insn, opsize, dest, &addr);
    } else {
        gen_partset_reg(tcg_ctx, opsize, DREG(insn, 9), dest);
    }
    tcg_temp_free(tcg_ctx, dest);
}